

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_common.cc
# Opt level: O1

void google::protobuf::compiler::java::SetCommonFieldVariables
               (FieldDescriptor *descriptor,FieldGeneratorInfo *info,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ushort *puVar3;
  pointer pcVar4;
  bool bVar5;
  JavaType JVar6;
  Nonnull<char_*> pcVar7;
  Descriptor *pDVar8;
  Nonnull<const_char_*> failure_msg;
  char *pcVar9;
  AlphaNum *pAVar10;
  FieldDescriptor *field;
  char *pcVar11;
  _Alloc_hider _Var12;
  char *pcVar13;
  string_view sVar14;
  string kt_property_name;
  anon_union_8_1_a8a14541_for_iterator_2 in_stack_fffffffffffffeb0;
  basic_string_view<char,_std::char_traits<char>_> bVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  string local_120;
  undefined1 local_100 [48];
  anon_union_8_1_a8a14541_for_iterator_2 local_d0;
  anon_union_8_1_a8a14541_for_iterator_2 local_c8;
  undefined1 local_c0 [32];
  string local_a0;
  string local_80;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_60;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_48;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_false> local_40;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
  local_38;
  
  local_c8 = local_d0;
  puVar3 = (ushort *)(descriptor->all_names_).payload_;
  _Var12._M_p = (pointer)&local_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffeb0,(long)puVar3 + ~(ulong)*puVar3,(long)puVar3 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_d0,variables,(char (*) [11])0x5e56e8);
  std::__cxx11::string::operator=
            ((string *)((long)local_c8.slot_ + 0x10),(string *)&stack0xfffffffffffffeb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var12._M_p != &local_140) {
    operator_delete(_Var12._M_p,local_140._M_allocated_capacity + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&stack0xfffffffffffffeb0,variables,(char (*) [5])0x7203be);
  std::__cxx11::string::_M_assign((string *)((long)in_stack_fffffffffffffeb0.slot_ + 0x10));
  puVar3 = (ushort *)(descriptor->containing_type_->all_names_).payload_;
  bVar15._M_str = (char *)in_stack_fffffffffffffeb0.slot_;
  bVar15._M_len = (size_t)&local_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffeb0,(long)puVar3 + ~(ulong)*puVar3,(long)puVar3 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_d0,variables,(char (*) [10])0x5620ff);
  std::__cxx11::string::operator=
            ((string *)((long)local_c8.slot_ + 0x10),(string *)&stack0xfffffffffffffeb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bVar15._M_len != &local_140) {
    operator_delete((pointer)bVar15._M_len,local_140._M_allocated_capacity + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&stack0xfffffffffffffeb0,variables,(char (*) [17])0x5e544e);
  std::__cxx11::string::_M_assign((string *)((long)bVar15._M_str + 0x10));
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[21]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&stack0xfffffffffffffeb0,variables,(char (*) [21])"disambiguated_reason");
  _Var12._M_p = (pointer)bVar15._M_len;
  std::__cxx11::string::_M_assign((string *)((long)bVar15._M_str + 0x10));
  FieldConstantName_abi_cxx11_((string *)&stack0xfffffffffffffeb0,(java *)descriptor,field);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_d0,variables,(char (*) [14])0x5d456f);
  std::__cxx11::string::operator=
            ((string *)((long)local_c8.slot_ + 0x10),(string *)&stack0xfffffffffffffeb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var12._M_p != &local_140) {
    operator_delete(_Var12._M_p,local_140._M_allocated_capacity + 1);
  }
  pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (descriptor->number_,local_140._M_local_buf);
  sVar14._M_str = (char *)&local_140;
  sVar14._M_len = (long)pcVar7 - (long)&local_140;
  local_d0 = (anon_union_8_1_a8a14541_for_iterator_2)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,&local_140,pcVar7);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[7]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_100,variables,(char (*) [7])0x6e9ba7);
  std::__cxx11::string::operator=((string *)(local_100._8_8_ + 0x10),(string *)&local_d0);
  if (local_d0.slot_ != (slot_type *)local_c0) {
    operator_delete(local_d0.slot_,local_c0._0_8_ + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[15]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&stack0xfffffffffffffeb0,variables,(char (*) [15])"kt_dsl_builder");
  std::__cxx11::string::_M_replace
            ((ulong)((long)sVar14._M_str + 0x10),0,*(char **)((long)sVar14._M_str + 0x18),0x633097);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[2]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&stack0xfffffffffffffeb0,variables,(char (*) [2])0x5752de);
  pcVar13 = "";
  std::__cxx11::string::_M_replace
            ((ulong)((long)sVar14._M_str + 0x10),0,*(char **)((long)sVar14._M_str + 0x18),0x50989c);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[2]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&stack0xfffffffffffffeb0,variables,(char (*) [2])0x64e2bd);
  std::__cxx11::string::_M_replace
            ((ulong)((long)sVar14._M_str + 0x10),0,*(char **)((long)sVar14._M_str + 0x18),0x50989c);
  bVar5 = IsForbiddenKotlin(sVar14);
  if (bVar5) {
    pAVar10 = (AlphaNum *)(info->name)._M_string_length;
    sVar14._M_str = (info->name)._M_dataplus._M_p;
    sVar14._M_len = (size_t)pAVar10;
    local_c8 = (anon_union_8_1_a8a14541_for_iterator_2)"_";
    local_d0 = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_100,(lts_20250127 *)&stack0xfffffffffffffeb0,(AlphaNum *)&local_d0,
               pAVar10);
  }
  else {
    local_100._0_8_ = local_100 + 0x10;
    pcVar4 = (info->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,pcVar4,pcVar4 + (info->name)._M_string_length);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[8]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_c0 + 0x20),variables,(char (*) [8])"kt_name");
  std::__cxx11::string::_M_assign((string *)(local_a0._M_string_length + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  pcVar4 = (info->capitalized_name)._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar4,pcVar4 + (info->capitalized_name)._M_string_length);
  GetKotlinPropertyName((string *)(local_c0 + 0x20),&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&stack0xfffffffffffffeb0,variables,(char (*) [17])"kt_property_name");
  std::__cxx11::string::_M_assign((string *)((long)sVar14._M_str + 0x10));
  bVar5 = IsForbiddenKotlin(sVar14);
  if (bVar5) {
    sVar14._M_str = "`";
    sVar14._M_len = 1;
    local_c8 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0._M_dataplus._M_p;
    local_d0 = (anon_union_8_1_a8a14541_for_iterator_2)local_a0._M_string_length;
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1;
    local_100._8_8_ = "`";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_120,(lts_20250127 *)&stack0xfffffffffffffeb0,(AlphaNum *)&local_d0,
               (AlphaNum *)local_100,(AlphaNum *)local_a0._M_string_length);
  }
  else {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_a0._M_dataplus._M_p,
               (char *)(local_a0._M_string_length + (long)local_a0._M_dataplus._M_p));
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[13]>(&local_60,variables,(char (*) [13])"kt_safe_name");
  std::__cxx11::string::operator=
            ((string *)((long)local_60.first.field_1.slot_ + 0x10),(string *)&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  bVar5 = IsForbiddenKotlin(sVar14);
  if (bVar5) {
    local_c8 = (anon_union_8_1_a8a14541_for_iterator_2)"_";
    local_d0 = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_100,(lts_20250127 *)&stack0xfffffffffffffeb0,(AlphaNum *)&local_d0,
               (AlphaNum *)(info->capitalized_name)._M_string_length);
  }
  else {
    local_100._0_8_ = local_100 + 0x10;
    pcVar4 = (info->capitalized_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,pcVar4,pcVar4 + (info->capitalized_name)._M_string_length);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[20]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_120,variables,(char (*) [20])"kt_capitalized_name");
  std::__cxx11::string::_M_assign((string *)(local_120._M_string_length + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  bVar5 = (info->options).jvm_dsl;
  pcVar9 = "@kotlin.jvm.JvmSynthetic\n";
  if (bVar5 != false) {
    pcVar13 = "@kotlin.jvm.JvmSynthetic\n";
  }
  pcVar11 = pcVar13 + 0x19;
  if (bVar5 == false) {
    pcVar11 = pcVar13;
  }
  _Var12._M_p = (pointer)&local_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffeb0,pcVar13,pcVar11);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[14]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_d0,variables,(char (*) [14])"jvm_synthetic");
  std::__cxx11::string::operator=
            ((string *)((long)local_c8.slot_ + 0x10),(string *)&stack0xfffffffffffffeb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var12._M_p != &local_140) {
    operator_delete(_Var12._M_p,local_140._M_allocated_capacity + 1);
  }
  bVar2 = descriptor->field_0x1;
  pAVar10 = (AlphaNum *)CONCAT71((int7)((ulong)pcVar9 >> 8),bVar2);
  bVar5 = (bool)((bVar2 & 0x20) >> 5);
  if (0xbf < bVar2 == bVar5) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar5,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (failure_msg != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&stack0xfffffffffffffeb0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb54,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&stack0xfffffffffffffeb0);
  }
  if ((descriptor->field_0x1 & 0x20) == 0) {
    sVar14 = FieldTypeName((uint)descriptor->type_);
    _Var12._M_p = (pointer)&local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffeb0,sVar14._M_str,sVar14._M_str + sVar14._M_len);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[22]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_d0,variables,(char (*) [22])"annotation_field_type");
    std::__cxx11::string::operator=
              ((string *)((long)local_c8.slot_ + 0x10),(string *)&stack0xfffffffffffffeb0);
    local_100._16_8_ = local_140._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p == &local_140) goto LAB_0031c5f5;
  }
  else {
    JVar6 = GetJavaType(descriptor);
    if ((JVar6 == JAVATYPE_MESSAGE) &&
       (pDVar8 = FieldDescriptor::message_type(descriptor),
       (pDVar8->options_->field_0)._impl_.map_entry_ == true)) {
      FieldTypeName((uint)descriptor->type_);
      local_c8 = (anon_union_8_1_a8a14541_for_iterator_2)"MAP";
      local_d0 = (anon_union_8_1_a8a14541_for_iterator_2)0x3;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_100,(lts_20250127 *)&stack0xfffffffffffffeb0,(AlphaNum *)&local_d0,
                 pAVar10);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[22]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_120,variables,(char (*) [22])"annotation_field_type");
      std::__cxx11::string::operator=
                ((string *)(local_120._M_string_length + 0x10),(string *)local_100);
      _Var12._M_p = (pointer)local_100._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_100 + 0x10)) goto LAB_0031c5f5;
    }
    else {
      FieldTypeName((uint)descriptor->type_);
      local_c8 = (anon_union_8_1_a8a14541_for_iterator_2)"_LIST";
      local_d0 = (anon_union_8_1_a8a14541_for_iterator_2)0x5;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_100,(lts_20250127 *)&stack0xfffffffffffffeb0,(AlphaNum *)&local_d0,
                 pAVar10);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[22]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_120,variables,(char (*) [22])"annotation_field_type");
      std::__cxx11::string::operator=
                ((string *)(local_120._M_string_length + 0x10),(string *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      bVar5 = FieldDescriptor::is_packed(descriptor);
      paVar1 = &local_120.field_2;
      if (!bVar5) goto LAB_0031c5f5;
      _local_d0 = FieldTypeName((uint)descriptor->type_);
      local_100._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xc;
      local_100._8_8_ = "_LIST_PACKED";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_120,(lts_20250127 *)&local_d0,(AlphaNum *)local_100,pAVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p == paVar1) {
        local_130._8_8_ = local_120.field_2._8_8_;
        local_140._M_allocated_capacity = (size_type)&local_130;
      }
      else {
        local_140._M_allocated_capacity = (size_type)local_120._M_dataplus._M_p;
      }
      local_130._M_allocated_capacity._1_7_ = local_120.field_2._M_allocated_capacity._1_7_;
      local_130._M_local_buf[0] = local_120.field_2._M_local_buf[0];
      local_140._8_8_ = local_120._M_string_length;
      local_120._M_string_length = 0;
      local_120.field_2._M_local_buf[0] = '\0';
      local_38._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140;
      local_120._M_dataplus._M_p = (pointer)paVar1;
      local_48 = variables;
      local_40._M_head_impl =
           (basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffeb0;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::EmplaceDecomposable::operator()
                (&local_60,&local_48,
                 (basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffeb0,
                 (piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)&local_40,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                  *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_allocated_capacity != &local_130) {
        operator_delete((void *)local_140._M_allocated_capacity,local_130._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p == paVar1) goto LAB_0031c5f5;
      local_100._16_8_ =
           CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,local_120.field_2._M_local_buf[0])
      ;
      _Var12._M_p = local_120._M_dataplus._M_p;
    }
  }
  operator_delete(_Var12._M_p,(ulong)(local_100._16_8_ + 1));
LAB_0031c5f5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SetCommonFieldVariables(
    const FieldDescriptor* descriptor, const FieldGeneratorInfo* info,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)["field_name"] = std::string(descriptor->name());
  (*variables)["name"] = info->name;
  (*variables)["classname"] =
      std::string(descriptor->containing_type()->name());
  (*variables)["capitalized_name"] = info->capitalized_name;
  (*variables)["disambiguated_reason"] = info->disambiguated_reason;
  (*variables)["constant_name"] = FieldConstantName(descriptor);
  (*variables)["number"] = absl::StrCat(descriptor->number());
  (*variables)["kt_dsl_builder"] = "_builder";
  // These variables are placeholders to pick out the beginning and ends of
  // identifiers for annotations (when doing so with existing variables would
  // be ambiguous or impossible). They should never be set to anything but the
  // empty string.
  (*variables)["{"] = "";
  (*variables)["}"] = "";
  (*variables)["kt_name"] = IsForbiddenKotlin(info->name)
                                ? absl::StrCat(info->name, "_")
                                : info->name;
  auto kt_property_name = GetKotlinPropertyName(info->capitalized_name);
  (*variables)["kt_property_name"] = kt_property_name;
  (*variables)["kt_safe_name"] = IsForbiddenKotlin(kt_property_name)
                                     ? absl::StrCat("`", kt_property_name, "`")
                                     : kt_property_name;
  (*variables)["kt_capitalized_name"] =
      IsForbiddenKotlin(info->name) ? absl::StrCat(info->capitalized_name, "_")
                                    : info->capitalized_name;
  (*variables)["jvm_synthetic"] = JvmSynthetic(info->options.jvm_dsl);
  if (!descriptor->is_repeated()) {
    (*variables)["annotation_field_type"] =
        std::string(FieldTypeName(descriptor->type()));
  } else if (GetJavaType(descriptor) == JAVATYPE_MESSAGE &&
             IsMapEntry(descriptor->message_type())) {
    (*variables)["annotation_field_type"] =
        absl::StrCat(FieldTypeName(descriptor->type()), "MAP");
  } else {
    (*variables)["annotation_field_type"] =
        absl::StrCat(FieldTypeName(descriptor->type()), "_LIST");
    if (descriptor->is_packed()) {
      variables->insert(
          {"annotation_field_type",
           absl::StrCat(FieldTypeName(descriptor->type()), "_LIST_PACKED")});
    }
  }
}